

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_python.cc
# Opt level: O0

dict get_frame_local(uint32_t num_frame_back)

{
  long lVar1;
  uint in_ESI;
  undefined4 in_register_0000003c;
  object this;
  bool bVar2;
  handle local_38;
  handle obj;
  PyObject *local;
  long lStack_20;
  uint32_t i;
  PyFrameObject *frame;
  uint32_t num_frame_back_local;
  
  this.super_handle.m_ptr._4_4_ = in_register_0000003c;
  this.super_handle.m_ptr._0_4_ = num_frame_back;
  lVar1 = PyThreadState_Get();
  lStack_20 = *(long *)(lVar1 + 0x18);
  local._4_4_ = 0;
  while( true ) {
    bVar2 = false;
    if (*(long *)(lStack_20 + 0x18) != 0) {
      local._4_4_ = local._4_4_ + 1;
      bVar2 = local._4_4_ < in_ESI;
    }
    if (!bVar2) break;
    lStack_20 = *(long *)(lStack_20 + 0x18);
  }
  if (lStack_20 != 0) {
    PyFrame_FastToLocals(lStack_20);
    obj.m_ptr = *(PyObject **)(lStack_20 + 0x38);
    if (obj.m_ptr != (PyObject *)0x0) {
      pybind11::handle::handle(&local_38,obj.m_ptr);
      pybind11::handle::cast<pybind11::dict>((handle *)this.super_handle.m_ptr);
      return (dict)this.super_handle.m_ptr.m_ptr;
    }
    obj.m_ptr = (PyObject *)0x0;
  }
  pybind11::dict::dict((dict *)this.super_handle.m_ptr);
  return (dict)this.super_handle.m_ptr;
}

Assistant:

py::dict get_frame_local(uint32_t num_frame_back) {
    PyFrameObject *frame = PyThreadState_Get()->frame;
    uint32_t i = 0;
    while (frame->f_back && (++i) < num_frame_back) {
        frame = frame->f_back;
    }
    if (frame) {
        // implementation copied from
        // https://github.com/python/cpython/blob/master/Python/ceval.c
        // PyEval_GetLocals(void)
        PyFrame_FastToLocals(frame);
        auto local = frame->f_locals;
        if (local) {
            py::handle obj(local);
            return obj.cast<py::dict>();
        }
    }
    return py::dict();
}